

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::setObjectNameWithoutBindings(QObjectPrivate *this,QString *name)

{
  QPropertyData<QString> *in_RSI;
  parameter_type in_RDI;
  QObjectPrivate *unaff_retaddr;
  
  ensureExtraData(unaff_retaddr);
  QPropertyData<QString>::setValueBypassingBindings(in_RSI,in_RDI);
  return;
}

Assistant:

void QObjectPrivate::setObjectNameWithoutBindings(const QString &name)
{
    ensureExtraData();
    extraData->objectName.setValueBypassingBindings(name);
}